

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall t_rb_generator::generate_service(t_rb_generator *this,t_service *tservice)

{
  t_rb_ofstream *out;
  undefined1 *puVar1;
  t_program *this_00;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_rb_ofstream *ptVar4;
  undefined4 extraout_var_01;
  string *this_01;
  t_rb_generator *ptVar5;
  allocator local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  undefined1 local_158 [24];
  undefined1 local_140 [24];
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string f_service_name;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  t_generator::underscore(&local_178,(t_generator *)this,&local_48);
  std::operator+(&local_198,&this->namespace_dir_,&local_178);
  std::operator+(&f_service_name,&local_198,".rb");
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_48);
  out = &this->f_service_;
  std::ofstream::open((char *)out,(_Ios_Openmode)f_service_name._M_dataplus._M_p);
  rb_autogen_comment_abi_cxx11_(&local_198,(t_rb_generator *)f_service_name._M_dataplus._M_p);
  poVar3 = std::operator<<((ostream *)out,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  render_require_thrift_abi_cxx11_(&local_178,this);
  std::operator<<(poVar3,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  if (tservice->extends_ != (t_service *)0x0) {
    if (this->namespaced_ == true) {
      poVar3 = std::operator<<((ostream *)out,"require \'");
      this_00 = (tservice->extends_->super_t_type).program_;
      std::__cxx11::string::string((string *)&local_a8,"rb",&local_199);
      t_program::get_namespace(&local_88,this_00,&local_a8);
      rb_namespace_to_path_prefix(&local_198,this,&local_88);
      poVar3 = std::operator<<(poVar3,(string *)&local_198);
      iVar2 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&local_c8,(string *)CONCAT44(extraout_var,iVar2));
      t_generator::underscore(&local_178,(t_generator *)this,&local_c8);
      poVar3 = std::operator<<(poVar3,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,"\'");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_88);
      this_01 = &local_a8;
    }
    else {
      poVar3 = std::operator<<((ostream *)out,"require \'");
      poVar3 = std::operator<<(poVar3,(string *)&this->require_prefix_);
      iVar2 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&local_e8,(string *)CONCAT44(extraout_var_00,iVar2));
      t_generator::underscore(&local_198,(t_generator *)this,&local_e8);
      poVar3 = std::operator<<(poVar3,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,"\'");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_198);
      this_01 = &local_e8;
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  poVar3 = std::operator<<((ostream *)out,"require \'");
  poVar3 = std::operator<<(poVar3,(string *)&this->require_prefix_);
  std::__cxx11::string::string
            ((string *)(local_140 + 0x38),
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  t_generator::underscore(&local_198,(t_generator *)this,(string *)(local_140 + 0x38));
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"_types\'");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(local_140 + 0x38));
  ptVar5 = (t_rb_generator *)local_140;
  ruby_modules_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ptVar5,this,(tservice->super_t_type).program_);
  begin_namespace(ptVar5,out,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_140);
  ptVar4 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar4,"module ");
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::__cxx11::string::string
            ((string *)(local_140 + 0x18),(string *)CONCAT44(extraout_var_01,iVar2));
  t_generator::capitalize(&local_198,(t_generator *)this,(string *)(local_140 + 0x18));
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(local_140 + 0x18));
  puVar1 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  generate_service_client(this,tservice);
  generate_service_server(this,tservice);
  generate_service_helpers(this,tservice);
  puVar1 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  ptVar4 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar4,"end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  ptVar5 = (t_rb_generator *)local_158;
  ruby_modules_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ptVar5,this,(tservice->super_t_type).program_);
  end_namespace(ptVar5,out,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&f_service_name);
  return;
}

Assistant:

void t_rb_generator::generate_service(t_service* tservice) {
  string f_service_name = namespace_dir_ + underscore(service_name_) + ".rb";
  f_service_.open(f_service_name.c_str());

  f_service_ << rb_autogen_comment() << endl << render_require_thrift();

  if (tservice->get_extends() != nullptr) {
    if (namespaced_) {
      f_service_ << "require '" << rb_namespace_to_path_prefix(
                                       tservice->get_extends()->get_program()->get_namespace("rb"))
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    } else {
      f_service_ << "require '" << require_prefix_
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    }
  }

  f_service_ << "require '" << require_prefix_ << underscore(program_name_) << "_types'" << endl
             << endl;

  begin_namespace(f_service_, ruby_modules(tservice->get_program()));

  f_service_.indent() << "module " << capitalize(tservice->get_name()) << endl;
  f_service_.indent_up();

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);

  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;

  end_namespace(f_service_, ruby_modules(tservice->get_program()));

  // Close service file
  f_service_.close();
}